

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

string * __thiscall
symbols::RangeObject::toString_abi_cxx11_(string *__return_storage_ptr__,RangeObject *this)

{
  ostream *poVar1;
  ostringstream local_190 [8];
  ostringstream out;
  RangeObject *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,"range ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->init_value);
  poVar1 = std::operator<<(poVar1,"..");
  std::ostream::operator<<(poVar1,this->end_value);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string RangeObject::toString() const
{
    std::ostringstream out;
    out << "range " << init_value << ".." << end_value;
    return out.str();
}